

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

Object<cmCMakePresetsGraphInternal::ConstCondition> * __thiscall
cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
Object<cmCMakePresetsGraphInternal::ConstCondition>::
Bind<cmCMakePresetsGraphInternal::ConstCondition,bool,std::function<cmCMakePresetsGraph::ReadFileResult(bool&,Json::Value_const*)>>
          (Object<cmCMakePresetsGraphInternal::ConstCondition> *this,string_view *name,
          offset_in_ConstCondition_to_bool member,
          function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)> *func,
          bool required)

{
  Object<cmCMakePresetsGraphInternal::ConstCondition> *pOVar1;
  anon_class_40_2_315d8239 local_78;
  MemberFunction local_50;
  byte local_29;
  function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)> *pfStack_28;
  bool required_local;
  function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)> *func_local;
  offset_in_ConstCondition_to_bool member_local;
  string_view *name_local;
  Object<cmCMakePresetsGraphInternal::ConstCondition> *this_local;
  
  local_29 = required;
  pfStack_28 = func;
  func_local = (function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)> *)member
  ;
  member_local = (offset_in_ConstCondition_to_bool)name;
  name_local = (string_view *)this;
  std::function<cmCMakePresetsGraph::ReadFileResult_(bool_&,_const_Json::Value_*)>::function
            (&local_78.func,func);
  local_78.member = (offset_in_ConstCondition_to_bool)func_local;
  std::
  function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::ConstCondition&,Json::Value_const*)>
  ::
  function<cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::Object<cmCMakePresetsGraphInternal::ConstCondition>::Bind<cmCMakePresetsGraphInternal::ConstCondition,bool,std::function<cmCMakePresetsGraph::ReadFileResult(bool&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,bool_cmCMakePresetsGraphInternal::ConstCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(bool&,Json::Value_const*)>,bool)::_lambda(cmCMakePresetsGraphInternal::ConstCondition&,Json::Value_const*)_1_,void>
            ((function<cmCMakePresetsGraph::ReadFileResult(cmCMakePresetsGraphInternal::ConstCondition&,Json::Value_const*)>
              *)&local_50,&local_78);
  pOVar1 = BindPrivate(this,name,&local_50,(bool)(local_29 & 1));
  std::
  function<cmCMakePresetsGraph::ReadFileResult_(cmCMakePresetsGraphInternal::ConstCondition_&,_const_Json::Value_*)>
  ::~function(&local_50);
  Bind<cmCMakePresetsGraphInternal::ConstCondition,bool,std::function<cmCMakePresetsGraph::ReadFileResult(bool&,Json::Value_const*)>>(std::basic_string_view<char,std::char_traits<char>>const&,bool_cmCMakePresetsGraphInternal::ConstCondition::*,std::function<cmCMakePresetsGraph::ReadFileResult(bool&,Json::Value_const*)>,bool)
  ::{lambda(cmCMakePresetsGraphInternal::ConstCondition&,Json::Value_const*)#1}::~basic_string_view
            ((_lambda_cmCMakePresetsGraphInternal__ConstCondition__Json__Value_const___1_ *)
             &local_78);
  return pOVar1;
}

Assistant:

Object& Bind(const cm::string_view& name, M U::*member, F func,
                 bool required = true)
    {
      return this->BindPrivate(name,
                               [func, member](T& out, const Json::Value* value,
                                              CallState&&... state) -> E {
                                 return func(out.*member, value,
                                             std::forward(state)...);
                               },
                               required);
    }